

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImBezierCubicClosestPointCasteljauStep
               (ImVec2 *p,ImVec2 *p_closest,ImVec2 *p_last,float *p_closest_dist2,float x1,float y1,
               float x2,float y2,float x3,float y3,float x4,float y4,float tess_tol,int level)

{
  ImVec2 *in_RCX;
  ImVec2 *in_RDX;
  ImVec2 *in_RSI;
  float in_R8D;
  float in_XMM0_Da;
  float fVar1;
  float level_00;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float in_XMM3_Da;
  float in_XMM4_Da;
  float in_XMM5_Da;
  float in_XMM6_Da;
  float in_XMM7_Da;
  float unaff_retaddr;
  float in_stack_00000008;
  float y1234;
  float x1234;
  float y234;
  float x234;
  float y123;
  float x123;
  float y34;
  float x34;
  float y23;
  float x23;
  float y12;
  float x12;
  float dist2;
  ImVec2 p_line;
  ImVec2 p_current;
  float d3;
  float d2;
  float dy;
  float dx;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  float local_a8;
  float local_a4;
  undefined4 in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff7c;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  ImVec2 local_70;
  ImVec2 local_64;
  ImVec2 local_5c;
  float local_54;
  float local_50;
  
  fVar1 = in_XMM6_Da - in_XMM0_Da;
  level_00 = in_XMM7_Da - in_XMM1_Da;
  local_a4 = (in_XMM2_Da - in_XMM6_Da) * level_00 + -((in_XMM3_Da - in_XMM7_Da) * fVar1);
  local_a8 = (in_XMM4_Da - in_XMM6_Da) * level_00 + -((in_XMM5_Da - in_XMM7_Da) * fVar1);
  if (local_a4 < 0.0) {
    local_a4 = -local_a4;
  }
  local_50 = local_a4;
  if (local_a8 < 0.0) {
    local_a8 = -local_a8;
  }
  local_54 = local_a8;
  if (in_stack_00000008 * (fVar1 * fVar1 + level_00 * level_00) <=
      (local_a4 + local_a8) * (local_a4 + local_a8)) {
    if ((int)in_R8D < 10) {
      ImBezierCubicClosestPointCasteljauStep
                (in_RSI,in_RDX,in_RCX,(float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da
                 ,in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_R8D,fVar1,unaff_retaddr,
                 (int)level_00);
      ImBezierCubicClosestPointCasteljauStep
                (in_RSI,in_RDX,in_RCX,(float *)CONCAT44(in_XMM0_Da,in_XMM1_Da),in_XMM2_Da,in_XMM3_Da
                 ,in_XMM4_Da,in_XMM5_Da,in_XMM6_Da,in_XMM7_Da,in_R8D,fVar1,unaff_retaddr,
                 (int)level_00);
    }
  }
  else {
    ImVec2::ImVec2(&local_5c,in_XMM6_Da,in_XMM7_Da);
    local_64 = ImLineClosestPoint((ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                                  (ImVec2 *)
                                  CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78));
    local_70 = operator-((ImVec2 *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                         (ImVec2 *)0x12617d);
    fVar1 = ImLengthSqr(&local_70);
    if (fVar1 < in_RCX->x) {
      *in_RSI = local_64;
      in_RCX->x = fVar1;
    }
    *in_RDX = local_5c;
  }
  return;
}

Assistant:

static void ImBezierCubicClosestPointCasteljauStep(const ImVec2& p, ImVec2& p_closest, ImVec2& p_last, float& p_closest_dist2, float x1, float y1, float x2, float y2, float x3, float y3, float x4, float y4, float tess_tol, int level)
{
    float dx = x4 - x1;
    float dy = y4 - y1;
    float d2 = ((x2 - x4) * dy - (y2 - y4) * dx);
    float d3 = ((x3 - x4) * dy - (y3 - y4) * dx);
    d2 = (d2 >= 0) ? d2 : -d2;
    d3 = (d3 >= 0) ? d3 : -d3;
    if ((d2 + d3) * (d2 + d3) < tess_tol * (dx * dx + dy * dy))
    {
        ImVec2 p_current(x4, y4);
        ImVec2 p_line = ImLineClosestPoint(p_last, p_current, p);
        float dist2 = ImLengthSqr(p - p_line);
        if (dist2 < p_closest_dist2)
        {
            p_closest = p_line;
            p_closest_dist2 = dist2;
        }
        p_last = p_current;
    }
    else if (level < 10)
    {
        float x12 = (x1 + x2)*0.5f,       y12 = (y1 + y2)*0.5f;
        float x23 = (x2 + x3)*0.5f,       y23 = (y2 + y3)*0.5f;
        float x34 = (x3 + x4)*0.5f,       y34 = (y3 + y4)*0.5f;
        float x123 = (x12 + x23)*0.5f,    y123 = (y12 + y23)*0.5f;
        float x234 = (x23 + x34)*0.5f,    y234 = (y23 + y34)*0.5f;
        float x1234 = (x123 + x234)*0.5f, y1234 = (y123 + y234)*0.5f;
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1, y1, x12, y12, x123, y123, x1234, y1234, tess_tol, level + 1);
        ImBezierCubicClosestPointCasteljauStep(p, p_closest, p_last, p_closest_dist2, x1234, y1234, x234, y234, x34, y34, x4, y4, tess_tol, level + 1);
    }
}